

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

RESULT_TYPE __thiscall
duckdb::Interpolator<true>::
InterpolateInternal<duckdb::interval_t,duckdb::QuantileDirect<duckdb::interval_t>>
          (Interpolator<true> *this,interval_t *v_t,QuantileDirect<duckdb::interval_t> *accessor)

{
  undefined4 uVar1;
  idx_t iVar2;
  idx_t iVar3;
  undefined4 uVar4;
  long lVar5;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<duckdb::interval_t>_>_> __comp;
  ulong uVar6;
  RESULT_TYPE RVar7;
  undefined7 uStack_17;
  
  iVar2 = this->begin;
  iVar3 = this->end;
  if (this->FRN != iVar3 && iVar2 != iVar3) {
    uVar6 = (long)(iVar3 * 0x10 + iVar2 * -0x10) >> 4;
    lVar5 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    __comp._M_comp._17_7_ = uStack_17;
    __comp._M_comp.desc = this->desc;
    __comp._M_comp.accessor_r = accessor;
    __comp._M_comp.accessor_l = accessor;
    ::std::
    __introselect<duckdb::interval_t*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileDirect<duckdb::interval_t>>>>
              (v_t + iVar2,v_t + this->FRN,v_t + iVar3,(ulong)(((uint)lVar5 ^ 0x3f) * 2) ^ 0x7e,
               __comp);
  }
  uVar1 = v_t[this->FRN].months;
  uVar4 = v_t[this->FRN].days;
  RVar7.days = uVar4;
  RVar7.months = uVar1;
  RVar7.micros = v_t[this->FRN].micros;
  return RVar7;
}

Assistant:

typename ACCESSOR::RESULT_TYPE InterpolateInternal(INPUT_TYPE *v_t, const ACCESSOR &accessor = ACCESSOR()) const {
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
		return accessor(v_t[FRN]);
	}